

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

bool __thiscall AInventory::Grind(AInventory *this,bool items)

{
  uint uVar1;
  TFlags<ActorFlag3,_unsigned_int> local_24;
  TFlags<ActorFlag,_unsigned_int> local_20;
  byte local_19;
  AInventory *pAStack_18;
  bool items_local;
  AInventory *this_local;
  
  if (items) {
    local_19 = items;
    pAStack_18 = this;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_20,(int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_20);
    if (uVar1 == 0) {
      this_local._7_1_ = AActor::Grind(&this->super_AActor,(bool)(local_19 & 1));
    }
    else {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_24,
                 (int)this + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
      uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
      if (uVar1 == 0) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AInventory::Grind(bool items)
{
	// Does this grind request even care about items?
	if (!items)
	{
		return false;
	}
	// Dropped items are normally destroyed by crushers. Set the DONTGIB flag,
	// and they'll act like corpses with it set and be immune to crushers.
	if (flags & MF_DROPPED)
	{
		if (!(flags3 & MF3_DONTGIB))
		{
			Destroy();
		}
		return false;
	}
	// Non-dropped items call the super method for compatibility.
	return Super::Grind(items);
}